

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::handleIoResizeArrayAccess
          (TParseContext *this,TSourceLoc *param_1,TIntermTyped *base)

{
  TSmallArrayVector *this_00;
  char cVar1;
  int iVar2;
  uint s;
  undefined4 extraout_var;
  long *plVar4;
  TQualifier *qualifier;
  long lVar5;
  long *plVar3;
  
  iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0xc])(base);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar3 != (long *)0x0) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0xf0))(plVar3);
    cVar1 = (**(code **)(*plVar4 + 0xf8))(plVar4);
    if (cVar1 != '\0') {
      plVar4 = (long *)(**(code **)(*plVar3 + 0xf0))(plVar3);
      qualifier = (TQualifier *)(**(code **)(*plVar4 + 0x58))(plVar4);
      s = getIoArrayImplicitSize(this,qualifier,(TString *)0x0);
      if (0 < (int)s) {
        lVar5 = (**(code **)(*plVar3 + 0xf8))(plVar3);
        this_00 = *(TSmallArrayVector **)(lVar5 + 0x60);
        TSmallArrayVector::changeFront(this_00,s);
        *(undefined1 *)((long)&this_00[1]._vptr_TSmallArrayVector + 4) = 0;
      }
    }
    return;
  }
  __assert_fail("symbolNode",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                ,0x305,
                "void glslang::TParseContext::handleIoResizeArrayAccess(const TSourceLoc &, TIntermTyped *)"
               );
}

Assistant:

void TParseContext::handleIoResizeArrayAccess(const TSourceLoc& /*loc*/, TIntermTyped* base)
{
    TIntermSymbol* symbolNode = base->getAsSymbolNode();
    assert(symbolNode);
    if (! symbolNode)
        return;

    // fix array size, if it can be fixed and needs to be fixed (will allow variable indexing)
    if (symbolNode->getType().isUnsizedArray()) {
        int newSize = getIoArrayImplicitSize(symbolNode->getType().getQualifier());
        if (newSize > 0)
            symbolNode->getWritableType().changeOuterArraySize(newSize);
    }
}